

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void luaD_call(lua_State *L,StkId func,int nResults)

{
  double dVar1;
  undefined8 uVar2;
  byte bVar3;
  GCObject *pGVar4;
  global_State *pgVar5;
  global_State *pgVar6;
  CallInfo *pCVar7;
  Table *events;
  double dVar8;
  double dVar9;
  uint uVar10;
  int iVar11;
  GCObject *pGVar12;
  GCObject *pGVar13;
  GCObject *pGVar14;
  Value *pVVar15;
  TValue *t1;
  TValue *t2;
  TValue *pTVar16;
  global_State *g_1;
  Value *val;
  long lVar17;
  StkId pTVar18;
  int *piVar19;
  ulong uVar20;
  TValue *pTVar21;
  uint uVar22;
  uint *puVar23;
  int iVar24;
  char *fmt;
  TMS op;
  uint *puVar25;
  StkId pTVar26;
  uint uVar27;
  uint uVar28;
  long *plVar29;
  Table *pTVar30;
  long lVar31;
  TValue *i_o;
  Value *pVVar32;
  StkId pTVar33;
  bool bVar34;
  lua_Number lVar35;
  TValue g;
  int local_54;
  Value local_40;
  undefined4 local_38;
  
  uVar10 = *(int *)&L->nCcalls + 1;
  L->nCcalls = (unsigned_short)uVar10;
  uVar10 = uVar10 & 0xffff;
  if (199 < uVar10) {
    if (uVar10 == 200) {
      fmt = "C stack overflow";
LAB_00106768:
      luaG_runerror(L,fmt);
    }
    if (0xe0 < uVar10) {
      luaD_throw(L,5);
    }
  }
  iVar11 = luaD_precall(L,func,nResults);
  if (iVar11 != 0) {
LAB_001053f3:
    L->nCcalls = L->nCcalls - 1;
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
      luaC_step(L);
      return;
    }
    return;
  }
  local_54 = 1;
LAB_00105443:
  pTVar26 = L->base;
  pGVar4 = (L->ci->func->value).gc;
  pTVar33 = (StkId)((pGVar4->th).l_G)->frealloc;
  puVar23 = L->savedpc;
LAB_00105468:
  do {
    puVar25 = puVar23;
    puVar23 = puVar25 + 1;
    uVar10 = *puVar25;
  } while (0x25 < (uVar10 & 0x3f));
  uVar28 = uVar10 >> 6 & 0xff;
  pVVar32 = (Value *)((long)&pTVar26->value + (ulong)(uVar28 << 4));
  switch(uVar10 & 0x3f) {
  case 0:
    uVar20 = (ulong)(uVar10 >> 0x13 & 0xfffffff0);
    *pVVar32 = *(Value *)((long)&pTVar26->value + uVar20);
    pVVar32[1].b = *(int *)((long)&pTVar26->tt + uVar20);
    goto LAB_00105468;
  case 1:
    uVar20 = (ulong)(uVar10 >> 10 & 0xfffffff0);
    *pVVar32 = *(Value *)((long)&pTVar33->value + uVar20);
    pVVar32[1].b = *(int *)((long)&pTVar33->tt + uVar20);
    goto LAB_00105468;
  case 2:
    pVVar32->b = uVar10 >> 0x17;
    pVVar32[1].b = 1;
    if ((uVar10 & 0x7fc000) != 0) {
      puVar23 = puVar25 + 2;
    }
    goto LAB_00105468;
  case 3:
    pVVar15 = (Value *)((long)&pTVar26->value + (ulong)(uVar10 >> 0x13 & 0xfffffff0));
    do {
      pVVar15[1].b = 0;
      pVVar15 = pVVar15 + -2;
    } while (pVVar32 <= pVVar15);
    goto LAB_00105468;
  case 4:
    pVVar15 = *(Value **)(*(long *)((long)pGVar4 + (ulong)(uVar10 >> 0x17) * 8 + 0x28) + 0x10);
    *pVVar32 = *pVVar15;
    pVVar32[1].b = pVVar15[1].b;
    goto LAB_00105468;
  case 5:
    pTVar16 = (TValue *)((long)&pTVar33->value + (ulong)(uVar10 >> 10 & 0xfffffff0));
    local_40 = (Value)(pGVar4->h).array;
    pVVar15 = &local_40;
    local_38 = 5;
    L->savedpc = puVar23;
    goto LAB_00105d3a;
  case 6:
    uVar20 = (ulong)(uVar10 >> 0x13 & 0xfffffff0);
    goto LAB_00105d1d;
  case 7:
    local_40 = (Value)(pGVar4->h).array;
    pVVar15 = &local_40;
    local_38 = 5;
    L->savedpc = puVar23;
    pTVar16 = (TValue *)((long)&pTVar33->value + (ulong)(uVar10 >> 10 & 0xfffffff0));
    val = pVVar32;
    goto LAB_001059d4;
  case 8:
    lVar31 = *(long *)((long)pGVar4 + (ulong)(uVar10 >> 0x17) * 8 + 0x28);
    pVVar15 = *(Value **)(lVar31 + 0x10);
    *pVVar15 = *pVVar32;
    iVar11 = pVVar32[1].b;
    pVVar15[1].b = iVar11;
    if (((3 < iVar11) && (((pVVar32->gc->gch).marked & 3) != 0)) &&
       ((*(byte *)(lVar31 + 9) & 4) != 0)) {
      pgVar5 = L->l_G;
      if (pgVar5->gcstate == '\x01') {
        reallymarkobject(pgVar5,pVVar32->gc);
      }
      else {
        *(byte *)(lVar31 + 9) = pgVar5->currentwhite & 3 | *(byte *)(lVar31 + 9) & 0xf8;
      }
    }
    goto LAB_00105468;
  case 9:
    pTVar16 = (TValue *)((long)&pTVar26->value + (ulong)(uVar10 >> 0x13 & 0xfffffff0));
    if ((int)uVar10 < 0) {
      pTVar16 = (TValue *)((long)&pTVar33->value + (ulong)(uVar10 >> 0x13 & 0xff0));
    }
    if ((uVar10 >> 0x16 & 1) != 0) {
      pTVar26 = pTVar33;
    }
    L->savedpc = puVar23;
    val = (Value *)((long)&pTVar26->value + (ulong)(uVar10 >> 10 & 0xff0));
    pVVar15 = pVVar32;
LAB_001059d4:
    luaV_settable(L,(TValue *)pVVar15,pTVar16,(StkId)val);
    goto LAB_00106301;
  case 10:
    uVar22 = uVar10 >> 0x11 & 0x1f;
    uVar28 = (uVar10 >> 0xe & 7 | 8) << ((char)uVar22 - 1U & 0x1f);
    if (uVar22 == 0) {
      uVar28 = uVar10 >> 0xe & 0x1ff;
    }
    uVar27 = uVar10 >> 0x1a & 0x1f;
    uVar22 = (uVar10 >> 0x17 & 7 | 8) << ((char)uVar27 - 1U & 0x1f);
    if (uVar27 == 0) {
      uVar22 = uVar10 >> 0x17;
    }
    pGVar14 = (GCObject *)luaH_new(L,uVar22,uVar28);
    pVVar32->gc = pGVar14;
    pVVar32[1].b = 5;
    L->savedpc = puVar23;
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
LAB_001063a0:
      luaC_step(L);
    }
    goto LAB_00106301;
  case 0xb:
    uVar20 = (ulong)(uVar10 >> 0x13 & 0xfffffff0);
    pVVar32[2] = *(Value *)((long)&pTVar26->value + uVar20);
    pVVar32[3].b = *(int *)((long)&pTVar26->tt + uVar20);
LAB_00105d1d:
    pVVar15 = (Value *)((long)&pTVar26->value + uVar20);
    if ((uVar10 >> 0x16 & 1) != 0) {
      pTVar26 = pTVar33;
    }
    L->savedpc = puVar23;
    pTVar16 = (TValue *)((long)&pTVar26->value + (ulong)(uVar10 >> 10 & 0xff0));
LAB_00105d3a:
    luaV_gettable(L,(TValue *)pVVar15,pTVar16,(StkId)pVVar32);
    goto LAB_00106301;
  case 0xc:
    pTVar21 = (TValue *)((long)&pTVar26->value + (ulong)(uVar10 >> 0x13 & 0xfffffff0));
    if ((int)uVar10 < 0) {
      pTVar21 = (TValue *)((long)&pTVar33->value + (ulong)(uVar10 >> 0x13 & 0xff0));
    }
    pTVar18 = pTVar33;
    if ((uVar10 >> 0x16 & 1) == 0) {
      pTVar18 = pTVar26;
    }
    pTVar16 = (TValue *)((long)&pTVar18->value + (ulong)(uVar10 >> 10 & 0xff0));
    if ((pTVar21->tt == 3) && (pTVar16->tt == 3)) {
      dVar9 = (pTVar21->value).n + (pTVar16->value).n;
LAB_00105cff:
      pVVar32->n = dVar9;
      pVVar32[1].b = 3;
      goto LAB_00105468;
    }
    L->savedpc = puVar23;
    op = TM_ADD;
    break;
  case 0xd:
    pTVar21 = (TValue *)((long)&pTVar26->value + (ulong)(uVar10 >> 0x13 & 0xfffffff0));
    if ((int)uVar10 < 0) {
      pTVar21 = (TValue *)((long)&pTVar33->value + (ulong)(uVar10 >> 0x13 & 0xff0));
    }
    pTVar18 = pTVar33;
    if ((uVar10 >> 0x16 & 1) == 0) {
      pTVar18 = pTVar26;
    }
    pTVar16 = (TValue *)((long)&pTVar18->value + (ulong)(uVar10 >> 10 & 0xff0));
    if ((pTVar21->tt == 3) && (pTVar16->tt == 3)) {
      dVar9 = (pTVar21->value).n - (pTVar16->value).n;
      goto LAB_00105cff;
    }
    L->savedpc = puVar23;
    op = TM_SUB;
    break;
  case 0xe:
    pTVar21 = (TValue *)((long)&pTVar26->value + (ulong)(uVar10 >> 0x13 & 0xfffffff0));
    if ((int)uVar10 < 0) {
      pTVar21 = (TValue *)((long)&pTVar33->value + (ulong)(uVar10 >> 0x13 & 0xff0));
    }
    pTVar18 = pTVar33;
    if ((uVar10 >> 0x16 & 1) == 0) {
      pTVar18 = pTVar26;
    }
    pTVar16 = (TValue *)((long)&pTVar18->value + (ulong)(uVar10 >> 10 & 0xff0));
    if ((pTVar21->tt == 3) && (pTVar16->tt == 3)) {
      dVar9 = (pTVar21->value).n * (pTVar16->value).n;
      goto LAB_00105cff;
    }
    L->savedpc = puVar23;
    op = TM_MUL;
    break;
  case 0xf:
    pTVar21 = (TValue *)((long)&pTVar26->value + (ulong)(uVar10 >> 0x13 & 0xfffffff0));
    if ((int)uVar10 < 0) {
      pTVar21 = (TValue *)((long)&pTVar33->value + (ulong)(uVar10 >> 0x13 & 0xff0));
    }
    pTVar18 = pTVar33;
    if ((uVar10 >> 0x16 & 1) == 0) {
      pTVar18 = pTVar26;
    }
    pTVar16 = (TValue *)((long)&pTVar18->value + (ulong)(uVar10 >> 10 & 0xff0));
    if ((pTVar21->tt == 3) && (pTVar16->tt == 3)) {
      dVar9 = (pTVar21->value).n / (pTVar16->value).n;
      goto LAB_00105cff;
    }
    L->savedpc = puVar23;
    op = TM_DIV;
    break;
  case 0x10:
    pTVar21 = (TValue *)((long)&pTVar26->value + (ulong)(uVar10 >> 0x13 & 0xfffffff0));
    if ((int)uVar10 < 0) {
      pTVar21 = (TValue *)((long)&pTVar33->value + (ulong)(uVar10 >> 0x13 & 0xff0));
    }
    pTVar18 = pTVar33;
    if ((uVar10 >> 0x16 & 1) == 0) {
      pTVar18 = pTVar26;
    }
    pTVar16 = (TValue *)((long)&pTVar18->value + (ulong)(uVar10 >> 10 & 0xff0));
    if ((pTVar21->tt == 3) && (pTVar16->tt == 3)) {
      dVar9 = (pTVar21->value).n;
      dVar1 = (pTVar16->value).n;
      dVar8 = floor(dVar9 / dVar1);
      lVar35 = dVar9 - dVar8 * dVar1;
LAB_001063fe:
      pVVar32->n = lVar35;
      pVVar32[1].b = 3;
      goto LAB_00105468;
    }
    L->savedpc = puVar23;
    op = TM_MOD;
    break;
  case 0x11:
    pTVar21 = (TValue *)((long)&pTVar26->value + (ulong)(uVar10 >> 0x13 & 0xfffffff0));
    if ((int)uVar10 < 0) {
      pTVar21 = (TValue *)((long)&pTVar33->value + (ulong)(uVar10 >> 0x13 & 0xff0));
    }
    pTVar18 = pTVar33;
    if ((uVar10 >> 0x16 & 1) == 0) {
      pTVar18 = pTVar26;
    }
    pTVar16 = (TValue *)((long)&pTVar18->value + (ulong)(uVar10 >> 10 & 0xff0));
    if ((pTVar21->tt == 3) && (pTVar16->tt == 3)) {
      dVar9 = pow((pTVar21->value).n,(pTVar16->value).n);
      goto LAB_00105cff;
    }
    L->savedpc = puVar23;
    op = TM_POW;
    break;
  case 0x12:
    uVar20 = (ulong)(uVar10 >> 0x13 & 0xfffffff0);
    pTVar16 = (TValue *)((long)&pTVar26->value + uVar20);
    if (*(int *)((long)&pTVar26->tt + uVar20) == 3) {
      pVVar32->gc = (GCObject *)((ulong)(pTVar16->value).gc ^ 0x8000000000000000);
      pVVar32[1].b = 3;
      goto LAB_00105468;
    }
    L->savedpc = puVar23;
    op = TM_UNM;
    pTVar21 = pTVar16;
    break;
  case 0x13:
    uVar20 = (ulong)(uVar10 >> 0x13 & 0xfffffff0);
    iVar11 = *(int *)((long)&pTVar26->tt + uVar20);
    if (iVar11 == 0) {
      uVar10 = 1;
    }
    else if (iVar11 == 1) {
      uVar10 = (uint)(*(int *)((long)&pTVar26->value + uVar20) == 0);
    }
    else {
      uVar10 = 0;
    }
    *(uint *)pVVar32 = uVar10;
    pVVar32[1].b = 1;
    goto LAB_00105468;
  case 0x14:
    uVar20 = (ulong)(uVar10 >> 0x13 & 0xfffffff0);
    pTVar16 = (TValue *)((long)&pTVar26->value + uVar20);
    iVar11 = *(int *)((long)&pTVar26->tt + uVar20);
    if (iVar11 == 4) {
      uVar2 = *(undefined8 *)((long)(pTVar16->value).gc + 0x10);
      lVar35 = ((double)CONCAT44(0x45300000,(int)((ulong)uVar2 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
      goto LAB_001063fe;
    }
    if (iVar11 == 5) {
      iVar11 = luaH_getn(&((pTVar16->value).gc)->h);
      dVar9 = (double)iVar11;
      goto LAB_00105cff;
    }
    L->savedpc = puVar23;
    iVar11 = call_binTM(L,pTVar16,&luaO_nilobject_,(StkId)pVVar32,TM_LEN);
    if (iVar11 == 0) {
      luaG_runerror(L,"attempt to %s a %s value","get length of",luaT_typenames[pTVar16->tt]);
    }
    goto LAB_0010643a;
  case 0x15:
    uVar22 = uVar10 >> 0xe & 0x1ff;
    L->savedpc = puVar23;
    luaV_concat(L,(uVar22 - (uVar10 >> 0x17)) + 1,uVar22);
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
      luaC_step(L);
    }
    pTVar26 = L->base;
    uVar20 = (ulong)((uVar10 >> 0x17) << 4);
    *(undefined8 *)((long)&pTVar26->value + (ulong)(uVar28 << 4)) =
         *(undefined8 *)((long)&pTVar26->value + uVar20);
    *(undefined4 *)((long)&pTVar26->tt + (ulong)(uVar28 << 4)) =
         *(undefined4 *)((long)&pTVar26->tt + uVar20);
    goto LAB_00105468;
  case 0x16:
    goto switchD_0010549f_caseD_16;
  case 0x17:
    pTVar16 = (TValue *)((long)&pTVar26->value + (ulong)(uVar10 >> 0x13 & 0xfffffff0));
    if ((int)uVar10 < 0) {
      pTVar16 = (TValue *)((long)&pTVar33->value + (ulong)(uVar10 >> 0x13 & 0xff0));
    }
    if ((uVar10 >> 0x16 & 1) != 0) {
      pTVar26 = pTVar33;
    }
    uVar20 = (ulong)(uVar10 >> 10 & 0xff0);
    L->savedpc = puVar23;
    if (pTVar16->tt != *(int *)((long)&pTVar26->tt + uVar20)) goto LAB_0010622f;
    pTVar21 = (TValue *)((long)&pTVar26->value + uVar20);
    bVar34 = true;
    switch(pTVar16->tt) {
    case 0:
      break;
    case 1:
      bVar34 = (pTVar16->value).b == (pTVar21->value).b;
      break;
    default:
      bVar34 = (pTVar16->value).gc == (pTVar21->value).gc;
      break;
    case 3:
      bVar34 = (bool)(-((pTVar21->value).n == (pTVar16->value).n) & 1);
      break;
    case 5:
    case 7:
      if ((pTVar16->value).gc != (pTVar21->value).gc) {
        pTVar30 = (((pTVar16->value).gc)->h).metatable;
        if ((pTVar30 == (Table *)0x0) || ((pTVar30->flags & 0x10) != 0)) goto LAB_0010622f;
        events = (((pTVar21->value).gc)->h).metatable;
        t1 = luaT_gettm(pTVar30,TM_EQ,L->l_G->tmname[4]);
        if (t1 != (TValue *)0x0) {
          if (pTVar30 != events) {
            if ((events != (Table *)0x0) && ((events->flags & 0x10) == 0)) {
              t2 = luaT_gettm(events,TM_EQ,L->l_G->tmname[4]);
              if (t2 == (TValue *)0x0) goto LAB_00106628;
              iVar11 = luaO_rawequalObj(t1,t2);
              if (iVar11 != 0) goto LAB_00106063;
            }
LAB_0010622f:
            bVar34 = false;
            break;
          }
LAB_00106063:
          callTMres(L,L->top,t1,pTVar16,pTVar21);
          iVar11 = L->top->tt;
          if (iVar11 != 0) {
            if (iVar11 == 1) {
              bVar34 = (L->top->value).b != 0;
            }
            break;
          }
        }
LAB_00106628:
        bVar34 = false;
      }
    }
    uVar10 = (uint)bVar34;
    goto joined_r0x00106608;
  case 0x18:
    pTVar16 = (TValue *)((long)&pTVar26->value + (ulong)(uVar10 >> 0x13 & 0xfffffff0));
    if ((int)uVar10 < 0) {
      pTVar16 = (TValue *)((long)&pTVar33->value + (ulong)(uVar10 >> 0x13 & 0xff0));
    }
    if ((uVar10 >> 0x16 & 1) != 0) {
      pTVar26 = pTVar33;
    }
    L->savedpc = puVar23;
    uVar10 = luaV_lessthan(L,pTVar16,
                           (TValue *)((long)&pTVar26->value + (ulong)(uVar10 >> 10 & 0xff0)));
    if (uVar10 == uVar28) {
      puVar23 = puVar23 + ((ulong)(*puVar23 >> 0xe) - 0x1ffff);
    }
    goto LAB_0010661b;
  case 0x19:
    L->savedpc = puVar23;
    pTVar16 = (TValue *)((long)&pTVar26->value + (ulong)(uVar10 >> 0x13 & 0xfffffff0));
    if ((int)uVar10 < 0) {
      pTVar16 = (TValue *)((long)&pTVar33->value + (ulong)(uVar10 >> 0x13 & 0xff0));
    }
    if ((uVar10 >> 0x16 & 1) != 0) {
      pTVar26 = pTVar33;
    }
    uVar20 = (ulong)(uVar10 >> 10 & 0xff0);
    uVar10 = pTVar16->tt;
    uVar22 = *(uint *)((long)&pTVar26->tt + uVar20);
    if (uVar10 == uVar22) {
      pTVar21 = (TValue *)((long)&pTVar26->value + uVar20);
      if (uVar10 == 4) {
        iVar11 = l_strcmp(&((pTVar16->value).gc)->ts,&((pTVar21->value).gc)->ts);
        uVar10 = (uint)(iVar11 < 1);
      }
      else if (uVar10 == 3) {
        uVar10 = (uint)((pTVar16->value).n <= (pTVar21->value).n);
      }
      else {
        uVar10 = call_orderTM(L,pTVar16,pTVar21,TM_LE);
        if (uVar10 == 0xffffffff) {
          iVar11 = call_orderTM(L,pTVar21,pTVar16,TM_LT);
          if (iVar11 == -1) {
            luaG_ordererror(L,(TValue *)(ulong)(uint)pTVar16->tt,(TValue *)(ulong)(uint)pTVar21->tt)
            ;
            uVar10 = 0;
          }
          else {
            uVar10 = (uint)(iVar11 == 0);
          }
        }
      }
    }
    else {
      luaG_ordererror(L,(TValue *)(ulong)uVar10,(TValue *)(ulong)uVar22);
      uVar10 = 0;
    }
joined_r0x00106608:
    if (uVar10 == uVar28) {
      puVar23 = puVar23 + ((ulong)(*puVar23 >> 0xe) - 0x1ffff);
    }
LAB_0010661b:
    pTVar26 = L->base;
    goto LAB_0010661f;
  case 0x1a:
    if (pVVar32[1].b == 0) {
      uVar28 = 1;
    }
    else if (pVVar32[1].b == 1) {
      uVar28 = (uint)(pVVar32->b == 0);
    }
    else {
      uVar28 = 0;
    }
    if (uVar28 != (uVar10 >> 0xe & 0x1ff)) {
LAB_0010647c:
      puVar23 = puVar23 + ((ulong)(*puVar23 >> 0xe) - 0x1ffff);
    }
    goto LAB_0010661f;
  case 0x1b:
    uVar20 = (ulong)(uVar10 >> 0x13 & 0xfffffff0);
    pVVar15 = (Value *)((long)&pTVar26->value + uVar20);
    iVar11 = *(int *)((long)&pTVar26->tt + uVar20);
    if (iVar11 == 0) {
      uVar28 = 1;
    }
    else {
      uVar28 = 0;
      if (iVar11 == 1) {
        uVar28 = (uint)(pVVar15->b == 0);
      }
    }
    if (uVar28 != (uVar10 >> 0xe & 0x1ff)) {
      *pVVar32 = *pVVar15;
      pVVar32[1].b = iVar11;
      goto LAB_0010647c;
    }
    goto LAB_0010661f;
  case 0x1c:
    if (0x7fffff < uVar10) {
      L->top = (StkId)((long)pVVar32 + (ulong)(uVar10 >> 0x13 & 0xfffffff0));
    }
    uVar10 = uVar10 >> 0xe & 0x1ff;
    L->savedpc = puVar23;
    iVar11 = luaD_precall(L,(StkId)pVVar32,uVar10 - 1);
    if (iVar11 == 1) {
      if (uVar10 != 0) {
        L->top = L->ci->top;
      }
      goto LAB_0010643a;
    }
    if (iVar11 != 0) goto LAB_001053f3;
    local_54 = local_54 + 1;
    goto LAB_00105443;
  case 0x1d:
    if (0x7fffff < uVar10) {
      L->top = (StkId)((long)pVVar32 + (ulong)(uVar10 >> 0x13 & 0xfffffff0));
    }
    L->savedpc = puVar23;
    iVar11 = luaD_precall(L,(StkId)pVVar32,-1);
    if (iVar11 == 1) {
LAB_0010643a:
      pTVar26 = L->base;
      goto LAB_00105468;
    }
    if (iVar11 != 0) goto LAB_001053f3;
    pCVar7 = L->ci;
    pTVar26 = pCVar7[-1].func;
    pTVar33 = pCVar7->func;
    pTVar18 = pTVar26;
    if (L->openupval != (GCObject *)0x0) {
      luaF_close(L,pCVar7[-1].base);
      pTVar18 = pCVar7[-1].func;
    }
    pTVar18 = (StkId)(((long)pCVar7->base - (long)pTVar33) + (long)pTVar18);
    pCVar7[-1].base = pTVar18;
    L->base = pTVar18;
    if (pTVar33 < L->top) {
      piVar19 = &pTVar26->tt;
      lVar31 = 0;
      do {
        ((TValue *)(piVar19 + -2))->value = pTVar33->value;
        *piVar19 = pTVar33->tt;
        lVar31 = lVar31 + 1;
        pTVar33 = pTVar33 + 1;
        piVar19 = piVar19 + 4;
      } while (pTVar33 < L->top);
    }
    else {
      lVar31 = 0;
    }
    L->top = pTVar26 + lVar31;
    pCVar7[-1].top = pTVar26 + lVar31;
    pCVar7[-1].savedpc = L->savedpc;
    pCVar7[-1].tailcalls = pCVar7[-1].tailcalls + 1;
    L->ci = L->ci + -1;
    goto LAB_00105443;
  case 0x1e:
    goto switchD_0010549f_caseD_1e;
  case 0x1f:
    dVar9 = pVVar32->n + pVVar32[4].n;
    if (pVVar32[4].n <= 0.0) {
      if (dVar9 < pVVar32[2].n) goto LAB_00105468;
    }
    else if (pVVar32[2].n < dVar9) goto LAB_00105468;
    pVVar32->n = dVar9;
    pVVar32[1].b = 3;
    pVVar32[6].n = dVar9;
    pVVar32[7].b = 3;
    puVar23 = puVar23 + ((ulong)(uVar10 >> 0xe) - 0x1ffff);
    goto LAB_00105468;
  case 0x20:
    L->savedpc = puVar23;
    if ((pVVar32[1].b != 3) &&
       (pTVar16 = luaV_tonumber((TValue *)pVVar32,(TValue *)pVVar32), pTVar16 == (TValue *)0x0)) {
      fmt = "\'for\' initial value must be a number";
      goto LAB_00106768;
    }
    if ((pVVar32[3].b != 3) &&
       (pTVar16 = luaV_tonumber((TValue *)(pVVar32 + 2),(TValue *)(pVVar32 + 2)),
       pTVar16 == (TValue *)0x0)) {
      fmt = "\'for\' limit must be a number";
      goto LAB_00106768;
    }
    pVVar15 = pVVar32 + 4;
    if ((pVVar32[5].b != 3) &&
       (pVVar15 = &luaV_tonumber((TValue *)pVVar15,(TValue *)pVVar15)->value,
       pVVar15 == (Value *)0x0)) {
      fmt = "\'for\' step must be a number";
      goto LAB_00106768;
    }
    pVVar32->n = pVVar32->n - pVVar15->n;
    pVVar32[1].b = 3;
switchD_0010549f_caseD_16:
    puVar23 = puVar23 + ((ulong)(uVar10 >> 0xe) - 0x1ffff);
    goto LAB_00105468;
  case 0x21:
    pVVar32[10] = pVVar32[4];
    pVVar32[0xb].b = pVVar32[5].b;
    pVVar32[8] = pVVar32[2];
    pVVar32[9].b = pVVar32[3].b;
    pVVar32[6] = *pVVar32;
    pVVar32[7].b = pVVar32[1].b;
    L->top = (StkId)(pVVar32 + 0xc);
    L->savedpc = puVar23;
    luaD_call(L,(StkId)(pVVar32 + 6),uVar10 >> 0xe & 0x1ff);
    pTVar26 = L->base;
    L->top = L->ci->top;
    uVar20 = (ulong)(uVar28 << 4);
    iVar11 = *(int *)((long)&pTVar26[3].tt + uVar20);
    if (iVar11 != 0) {
      *(undefined8 *)((long)&pTVar26[2].value + uVar20) =
           *(undefined8 *)((long)&pTVar26[3].value + uVar20);
      *(int *)((long)&pTVar26[2].tt + uVar20) = iVar11;
      puVar23 = puVar23 + ((ulong)(*puVar23 >> 0xe) - 0x1ffff);
    }
LAB_0010661f:
    puVar23 = puVar23 + 1;
    goto LAB_00105468;
  case 0x22:
    if (uVar10 < 0x800000) {
      uVar22 = (int)((ulong)((long)L->top - (long)pVVar32) >> 4) - 1;
      L->top = L->ci->top;
    }
    else {
      uVar22 = uVar10 >> 0x17;
    }
    uVar10 = uVar10 >> 0xe & 0x1ff;
    if (uVar10 == 0) {
      uVar10 = puVar25[1];
      puVar23 = puVar25 + 2;
    }
    if (pVVar32[1].b == 5) {
      pGVar14 = pVVar32->gc;
      iVar11 = uVar22 + uVar10 * 0x32 + -0x32;
      if ((pGVar14->h).sizearray < iVar11) {
        if ((pGVar14->h).node == &dummynode_) {
          iVar24 = 0;
        }
        else {
          iVar24 = (int)(1L << ((pGVar14->h).lsizenode & 0x3f));
        }
        resize(L,&pGVar14->h,iVar11,iVar24);
      }
      if (0 < (int)uVar22) {
        plVar29 = (long *)((long)&pTVar26[uVar22].value + (ulong)(uVar28 << 4));
        uVar20 = (ulong)uVar22;
        do {
          pTVar16 = luaH_setnum(L,&pGVar14->h,uVar10 * 0x32 + -0x32 + (int)uVar20);
          (pTVar16->value).gc = (GCObject *)*plVar29;
          lVar31 = plVar29[1];
          pTVar16->tt = (int)lVar31;
          if (((3 < (int)lVar31) && ((*(byte *)(*plVar29 + 9) & 3) != 0)) &&
             (((pGVar14->gch).marked & 4) != 0)) {
            pgVar5 = L->l_G;
            (pGVar14->gch).marked = (pGVar14->gch).marked & 0xfb;
            (pGVar14->h).gclist = pgVar5->grayagain;
            pgVar5->grayagain = pGVar14;
          }
          plVar29 = plVar29 + -2;
          bVar34 = 1 < (long)uVar20;
          uVar20 = uVar20 - 1;
        } while (bVar34);
      }
    }
    goto LAB_00105468;
  case 0x23:
    luaF_close(L,(StkId)pVVar32);
    goto LAB_00105468;
  case 0x24:
    pGVar14 = (&(((((pGVar4->h).node)->i_key).nk.next)->i_val).value)[uVar10 >> 0xe].gc;
    bVar3 = (byte)*(lu_mem *)&(pGVar14->p).nups;
    pGVar12 = (GCObject *)luaF_newLclosure(L,(uint)bVar3,(Table *)(pGVar4->h).array);
    (pGVar12->th).l_G = (global_State *)pGVar14;
    if (bVar3 != 0) {
      uVar20 = 0;
      do {
        uVar10 = *puVar23 >> 0x17;
        if ((*puVar23 & 0x3f) == 4) {
          pGVar13 = *(GCObject **)((long)pGVar4 + (ulong)uVar10 * 8 + 0x28);
        }
        else {
          pTVar30 = (Table *)((long)&pTVar26->value + (ulong)(uVar10 << 4));
          pgVar5 = L->l_G;
          pGVar14 = (GCObject *)&L->openupval;
          do {
            pGVar13 = (pGVar14->gch).next;
            if ((pGVar13 == (GCObject *)0x0) || ((pGVar13->h).metatable < pTVar30)) {
              pGVar13 = (GCObject *)luaM_realloc_(L,(void *)0x0,0,0x28);
              (pGVar13->gch).tt = '\n';
              (pGVar13->gch).marked = pgVar5->currentwhite & 3;
              (pGVar13->h).metatable = pTVar30;
              (pGVar13->gch).next = (pGVar14->gch).next;
              (pGVar14->gch).next = pGVar13;
              (pGVar13->h).array = (TValue *)&pgVar5->uvhead;
              pgVar6 = (global_State *)(pgVar5->uvhead).u.l.next;
              (pGVar13->th).l_G = pgVar6;
              pgVar6->ud = pGVar13;
              (pgVar5->uvhead).u.l.next = (UpVal *)pGVar13;
              goto LAB_001055dc;
            }
            pGVar14 = pGVar13;
          } while ((pGVar13->h).metatable != pTVar30);
          if ((~pgVar5->currentwhite & (pGVar13->gch).marked & 3) != 0) {
            (pGVar13->gch).marked = (pGVar13->gch).marked ^ 3;
          }
        }
LAB_001055dc:
        *(GCObject **)((long)pGVar12 + uVar20 * 8 + 0x28) = pGVar13;
        uVar20 = uVar20 + 1;
        puVar23 = puVar23 + 1;
      } while (uVar20 != bVar3);
    }
    pVVar32->gc = pGVar12;
    pVVar32[1].b = 6;
    L->savedpc = puVar23;
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) goto LAB_001063a0;
    goto LAB_00106301;
  case 0x25:
    goto switchD_0010549f_caseD_25;
  }
  Arith(L,(StkId)pVVar32,pTVar21,pTVar16,op);
LAB_00106301:
  pTVar26 = L->base;
  goto LAB_00105468;
switchD_0010549f_caseD_25:
  pCVar7 = L->ci;
  uVar22 = ~(uint)*(byte *)((long)&((pGVar4->th).l_G)->GCthreshold + 1) +
           (int)((ulong)((long)pCVar7->base - (long)pCVar7->func) >> 4);
  lVar31 = (long)(int)uVar22;
  if (uVar10 < 0x800000) {
    L->savedpc = puVar23;
    if ((long)L->stack_last - (long)L->top <= (long)(int)(uVar22 * 0x10)) {
      iVar11 = L->stacksize;
      iVar24 = iVar11 * 2;
      if (iVar11 < (int)uVar22) {
        iVar24 = iVar11 + uVar22;
      }
      luaD_reallocstack(L,iVar24);
    }
    pTVar26 = L->base;
    pVVar32 = (Value *)((long)&pTVar26->value + (ulong)(uVar28 << 4));
    L->top = (StkId)(pVVar32 + lVar31 * 2);
  }
  else {
    uVar22 = (uVar10 >> 0x17) - 1;
  }
  if (0 < (int)uVar22) {
    pVVar32 = pVVar32 + 1;
    lVar17 = lVar31 * -0x10;
    uVar20 = 0;
    do {
      if ((long)uVar20 < lVar31) {
        pTVar18 = pCVar7->base;
        *(undefined8 *)(&pVVar32->b + -2) = *(undefined8 *)((long)&pTVar18->value + lVar17);
        pVVar32->b = *(int *)((long)&pTVar18->tt + lVar17);
      }
      else {
        pVVar32->b = 0;
      }
      uVar20 = uVar20 + 1;
      pVVar32 = (Value *)(&pVVar32->b + 4);
      lVar17 = lVar17 + 0x10;
    } while (uVar22 != uVar20);
  }
  goto LAB_00105468;
switchD_0010549f_caseD_1e:
  if (0x7fffff < uVar10) {
    L->top = (StkId)((long)pVVar32 + ((ulong)(uVar10 >> 0x13 & 0xfffffff0) - 0x10));
  }
  if (L->openupval != (GCObject *)0x0) {
    luaF_close(L,pTVar26);
  }
  L->savedpc = puVar23;
  iVar11 = luaD_poscall(L,(StkId)pVVar32);
  local_54 = local_54 + -1;
  if (local_54 == 0) goto LAB_001053f3;
  if (iVar11 != 0) {
    L->top = L->ci->top;
  }
  goto LAB_00105443;
}

Assistant:

static void luaD_call(lua_State*L,StkId func,int nResults){
if(++L->nCcalls>=200){
if(L->nCcalls==200)
luaG_runerror(L,"C stack overflow");
else if(L->nCcalls>=(200+(200>>3)))
luaD_throw(L,5);
}
if(luaD_precall(L,func,nResults)==0)
luaV_execute(L,1);
L->nCcalls--;
luaC_checkGC(L);
}